

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O1

ostream * std::operator<<(ostream *os,ushort2 *v)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::ushort2 &v) {
  os << "(" << v[0] << ", " << v[1] << ")";
  return os;
}